

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O2

double time_cc<std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                 (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *r)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  timer T;
  string res;
  double local_18;
  
  T._resolution = 1e-06;
  T._t.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  uVar2 = r->_M_x;
  dVar4 = 0.0;
  lVar1 = 0x1000000;
  while (bVar3 = lVar1 != 0, lVar1 = lVar1 + -1, bVar3) {
    uVar2 = (uVar2 * 0xbc8f) % 0x7fffffff;
    dVar4 = dVar4 + (double)((int)uVar2 + -1) * 4.656612879582606e-10;
  }
  r->_M_x = uVar2;
  timer::time(&T,(time_t *)0x7fffffff);
  local_18 = 16.777216 / extraout_XMM0_Qa;
  to_string<double>(&res,&local_18);
  while (res._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&res);
  }
  std::operator<<((ostream *)&std::cout,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  return dVar4;
}

Assistant:

double time_cc(R &r) {
  double s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += trng::utility::uniformcc<double>(r);
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}